

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::DebuggerScope::AddProperty
          (DebuggerScope *this,RegSlot location,PropertyId propertyId,
          DebuggerScopePropertyFlags flags)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  undefined1 local_2c [8];
  DebuggerScopeProperty scopeProperty;
  DebuggerScopePropertyFlags flags_local;
  PropertyId propertyId_local;
  RegSlot location_local;
  DebuggerScope *this_local;
  
  scopeProperty.propId = -1;
  local_2c._0_4_ = propertyId;
  local_2c._4_4_ = location;
  scopeProperty.location = flags;
  scopeProperty.byteCodeInitializationOffset = flags;
  scopeProperty.flags = propertyId;
  EnsurePropertyListIsAllocated(this);
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->scopeProperties);
  JsUtil::
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Add(this_00,(DebuggerScopeProperty *)local_2c);
  return;
}

Assistant:

void DebuggerScope::AddProperty(RegSlot location, Js::PropertyId propertyId, DebuggerScopePropertyFlags flags)
    {
        DebuggerScopeProperty scopeProperty;

        scopeProperty.location = location;
        scopeProperty.propId = propertyId;

        // This offset is uninitialized until the property is initialized (with a ld opcode, for example).
        scopeProperty.byteCodeInitializationOffset = Constants::InvalidByteCodeOffset;
        scopeProperty.flags = flags;

        // Delay allocate the property list so we don't take up memory if there are no properties in this scope.
        // Scopes are created during non-debug mode as well so we want to keep them as small as possible.
        this->EnsurePropertyListIsAllocated();

        // The property doesn't exist yet, so add it.
        this->scopeProperties->Add(scopeProperty);
    }